

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9Exorcism(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *pGia;
  char *pFileNameOut;
  int iVar1;
  uint uVar2;
  uint fUseQCost;
  undefined4 extraout_var;
  Abc_Ntk_t *pNtk;
  char **ppcVar3;
  char *pcVar4;
  int iVar5;
  uint fVerbose;
  uint local_58;
  uint local_54;
  Vec_Wec_t *vEsop;
  undefined8 local_40;
  Abc_Frame_t *local_38;
  
  vEsop = (Vec_Wec_t *)0x0;
  local_54 = 0;
  local_38 = pAbc;
  Extra_UtilGetoptReset();
  local_40 = 20000;
  local_58 = 2;
  fUseQCost = 0;
  fVerbose = 0;
LAB_0028f263:
  do {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"QVCqvh"), iVar5 = globalUtilOptind, iVar1 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar1 < 0x51) {
      if (iVar1 == -1) {
        if (globalUtilOptind + 2 == argc) {
          ppcVar3 = argv + (long)globalUtilOptind + 1;
          pcVar4 = ppcVar3[-1];
LAB_0028f36c:
          pGia = local_38->pGia;
          if (pGia == (Gia_Man_t *)0x0 && pcVar4 == (char *)0x0) {
            Abc_Print(-1,
                      "Abc_CommandAbc9Exorcism(): There is neither an AIG nor an ESOP-PLA file.\n");
            return 0;
          }
          pFileNameOut = *ppcVar3;
          if (pcVar4 == (char *)0x0) {
            if (pGia == (Gia_Man_t *)0x0) {
              iVar5 = -1;
              iVar1 = -1;
            }
            else {
              iVar5 = pGia->vCis->nSize;
              iVar1 = pGia->vCos->nSize;
              Eso_ManCompute(pGia,fVerbose,&vEsop);
            }
          }
          else {
            pNtk = Io_ReadPla(pcVar4,0,0,0,1,1);
            if (pNtk == (Abc_Ntk_t *)0x0) {
              puts("Reading PLA file has failed.");
              return 1;
            }
            iVar5 = pNtk->vCis->nSize;
            iVar1 = pNtk->vCos->nSize;
            vEsop = Abc_ExorcismNtk2Esop(pNtk);
            if (vEsop == (Vec_Wec_t *)0x0) {
              puts("Converting PLA to ESOP failed.");
              return 1;
            }
          }
          if (vEsop != (Vec_Wec_t *)0x0) {
            Abc_ExorcismMain(vEsop,iVar5,iVar1,pFileNameOut,local_58,local_54,(int)local_40,
                             fUseQCost);
            Vec_WecFree(vEsop);
            return 0;
          }
          return 0;
        }
        if (globalUtilOptind + 1 == argc) {
          ppcVar3 = argv + globalUtilOptind;
          pcVar4 = (char *)0x0;
          goto LAB_0028f36c;
        }
        pcVar4 = "Abc_CommandAbc9Exorcism(): Argument error.\n";
      }
      else {
        if (iVar1 != 0x43) goto LAB_0028f417;
        if (globalUtilOptind < argc) {
          uVar2 = atoi(argv[globalUtilOptind]);
          local_40 = CONCAT44(extraout_var,uVar2);
          goto joined_r0x0028f2ea;
        }
        pcVar4 = "Command line switch \"-C\" should be followed by an integer.\n";
      }
LAB_0028f40b:
      Abc_Print(-1,pcVar4);
      goto LAB_0028f417;
    }
    if (iVar1 == 0x71) {
      fUseQCost = fUseQCost ^ 1;
      goto LAB_0028f263;
    }
    if (iVar1 == 0x56) {
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-V\" should be followed by an integer.\n";
        goto LAB_0028f40b;
      }
      local_54 = atoi(argv[globalUtilOptind]);
      uVar2 = local_54;
    }
    else {
      if (iVar1 != 0x51) goto LAB_0028f417;
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-Q\" should be followed by an integer.\n";
        goto LAB_0028f40b;
      }
      local_58 = atoi(argv[globalUtilOptind]);
      uVar2 = local_58;
    }
joined_r0x0028f2ea:
    globalUtilOptind = iVar5 + 1;
    if ((int)uVar2 < 0) {
LAB_0028f417:
      Abc_Print(-2,"usage: &exorcism [-Q N] [-V N] [-C N] -q [file_in] <file_out>\n");
      Abc_Print(-2,"                     performs heuristic exclusive sum-of-project minimization\n"
               );
      Abc_Print(-2,"        -Q N       : minimization quality [default = %d]\n",(ulong)local_58);
      Abc_Print(-2,
                "                     increasing this number improves quality and adds to runtime\n"
               );
      Abc_Print(-2,"        -V N       : verbosity level [default = %d]\n",(ulong)local_54);
      Abc_Print(-2,"                     0 = no output; 1 = outline; 2 = verbose\n");
      Abc_Print(-2,"        -C N       : maximum number of cubes in startign cover [default = %d]\n"
                ,local_40);
      pcVar4 = "yes";
      if (fUseQCost == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"        -q         : toggle using quantum cost [default = %s]\n",pcVar4);
      Abc_Print(-2,
                "        [file_in]  : optional input file in ESOP-PLA format (otherwise current AIG is used)\n"
               );
      Abc_Print(-2,"        <file_out> : output file in ESOP-PLA format\n");
      Abc_Print(-2,"\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Exorcism( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern int Abc_ExorcismMain( Vec_Wec_t * vEsop, int nIns, int nOuts, char * pFileNameOut, int Quality, int Verbosity, int nCubesMax, int fUseQCost );
    extern Vec_Wec_t * Abc_ExorcismNtk2Esop( Abc_Ntk_t * pNtk );

    extern Gia_Man_t * Eso_ManCompute( Gia_Man_t * pGia, int fVerbose, Vec_Wec_t ** pvRes );
    Vec_Wec_t * vEsop = NULL;
    Abc_Ntk_t * pNtk = NULL;
    char * pFileNameIn = NULL;
    char * pFileNameOut = NULL;
    int c, Quality = 2, Verbosity = 0, nCubesMax = 20000, fUseQCost = 0, fVerbose = 0;
    int nInputs = -1, nOutputs = -1;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "QVCqvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'Q':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-Q\" should be followed by an integer.\n" );
                goto usage;
            }
            Quality = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Quality < 0 )
                goto usage;
            break;
        case 'V':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-V\" should be followed by an integer.\n" );
                goto usage;
            }
            Verbosity = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Verbosity < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nCubesMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nCubesMax < 0 )
                goto usage;
            break;
        case 'q':
            fUseQCost ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( argc == globalUtilOptind + 2 )
    {
        pFileNameIn = argv[globalUtilOptind];
        pFileNameOut = argv[globalUtilOptind + 1];
    }
    else if ( argc == globalUtilOptind + 1 )
    {
        pFileNameOut = argv[globalUtilOptind];
    }
    else
    {
        Abc_Print( -1, "Abc_CommandAbc9Exorcism(): Argument error.\n" );
        goto usage;
    }

    if ( pAbc->pGia == NULL && pFileNameIn == NULL )
    {
      Abc_Print( -1, "Abc_CommandAbc9Exorcism(): There is neither an AIG nor an ESOP-PLA file.\n" );
      return 0;
    }

    if ( pFileNameIn )
    {
        pNtk = Io_ReadPla( pFileNameIn, 0, 0, 0, /* no preprocessing = */1, /* check = */1 );
        if ( pNtk == NULL )
        {
            printf( "Reading PLA file has failed.\n" );
            return 1;
        }
        nInputs = Abc_NtkCiNum( pNtk );
        nOutputs = Abc_NtkCoNum( pNtk );
        vEsop = Abc_ExorcismNtk2Esop( pNtk );
        if ( vEsop == NULL )
        {
            printf( "Converting PLA to ESOP failed.\n" );
            return 1;
        }
    }
    else if ( pAbc->pGia )
    {
        // generate starting cover
        nInputs = Gia_ManCiNum( pAbc->pGia );
        nOutputs = Gia_ManCoNum( pAbc->pGia );
        Eso_ManCompute( pAbc->pGia, fVerbose, &vEsop );
    }

    if ( vEsop )
    {
        // run minimization
        Abc_ExorcismMain( vEsop, nInputs, nOutputs, pFileNameOut, Quality, Verbosity, nCubesMax, fUseQCost );
        Vec_WecFree( vEsop );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: &exorcism [-Q N] [-V N] [-C N] -q [file_in] <file_out>\n" );
    Abc_Print( -2, "                     performs heuristic exclusive sum-of-project minimization\n" );
    Abc_Print( -2, "        -Q N       : minimization quality [default = %d]\n", Quality);
    Abc_Print( -2, "                     increasing this number improves quality and adds to runtime\n");
    Abc_Print( -2, "        -V N       : verbosity level [default = %d]\n", Verbosity);
    Abc_Print( -2, "                     0 = no output; 1 = outline; 2 = verbose\n");
    Abc_Print( -2, "        -C N       : maximum number of cubes in startign cover [default = %d]\n", nCubesMax );
    Abc_Print( -2, "        -q         : toggle using quantum cost [default = %s]\n", fUseQCost? "yes": "no" );
    Abc_Print( -2, "        [file_in]  : optional input file in ESOP-PLA format (otherwise current AIG is used)\n");
    Abc_Print( -2, "        <file_out> : output file in ESOP-PLA format\n");
    Abc_Print( -2, "\n" );
    return 1;
}